

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getTempStore(char *z)

{
  int iVar1;
  char *z_local;
  
  if ((*z < '0') || ('2' < *z)) {
    iVar1 = sqlite3StrICmp(z,"file");
    if (iVar1 == 0) {
      z_local._4_4_ = 1;
    }
    else {
      iVar1 = sqlite3StrICmp(z,"memory");
      if (iVar1 == 0) {
        z_local._4_4_ = 2;
      }
      else {
        z_local._4_4_ = 0;
      }
    }
  }
  else {
    z_local._4_4_ = *z + -0x30;
  }
  return z_local._4_4_;
}

Assistant:

static int getTempStore(const char *z){
  if( z[0]>='0' && z[0]<='2' ){
    return z[0] - '0';
  }else if( sqlite3StrICmp(z, "file")==0 ){
    return 1;
  }else if( sqlite3StrICmp(z, "memory")==0 ){
    return 2;
  }else{
    return 0;
  }
}